

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>
::rehash(sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  EntryPointer begin;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int8_t iVar29;
  EntryPointer it;
  size_t sVar30;
  ulong uVar31;
  sherwood_v3_entry<const_slang::ast::Type_*> *psVar32;
  ulong uVar33;
  sherwood_v3_entry<const_slang::ast::Type_*> *psVar34;
  long lVar35;
  byte bVar36;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::ast::Type_*>_3 *key;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar62;
  int iVar63;
  undefined1 auVar60 [16];
  int iVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ulong local_38;
  
  auVar39._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_elements);
  auVar39._8_4_ = (int)(this->num_elements >> 0x20);
  auVar39._12_4_ = 0x45300000;
  auVar40._0_8_ = (double)this->_max_load_factor;
  auVar40._8_8_ = 0;
  dVar37 = ceil(((auVar39._8_8_ - 1.9342813113834067e+25) + (auVar39._0_8_ - 4503599627370496.0)) /
                auVar40._0_8_);
  local_38 = (long)(dVar37 - 9.223372036854776e+18) & (long)dVar37 >> 0x3f | (long)dVar37;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 == 0) {
    reset_to_empty_state(this);
    return;
  }
  iVar29 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
  sVar30 = this->num_slots_minus_one;
  if (sVar30 != 0) {
    sVar30 = sVar30 + 1;
  }
  if (local_38 != sVar30) {
    uVar31 = local_38 >> 1 | local_38;
    uVar31 = uVar31 >> 2 | uVar31;
    uVar31 = uVar31 >> 4 | uVar31;
    uVar31 = uVar31 >> 8 | uVar31;
    uVar31 = uVar31 >> 0x10 | uVar31;
    uVar31 = uVar31 >> 0x20 | uVar31;
    bVar36 = 4;
    if ('\x04' < (char)log2(unsigned_long)::table
                       [(uVar31 - (uVar31 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
      bVar36 = log2(unsigned_long)::table[(uVar31 - (uVar31 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
    }
    psVar32 = __gnu_cxx::new_allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>
              ::allocate((new_allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>
                          *)this,local_38 + bVar36,(void *)0x0);
    auVar28 = _DAT_003e7450;
    auVar27 = _DAT_003e7440;
    auVar26 = _DAT_003e7430;
    auVar25 = _DAT_003e7420;
    auVar24 = _DAT_003e7410;
    auVar23 = _DAT_003e7400;
    auVar39 = _DAT_003e64d0;
    if (psVar32 != psVar32 + local_38 + ((ulong)bVar36 - 1)) {
      uVar31 = local_38 + bVar36 + 0xffffffffffffffe;
      uVar33 = uVar31 & 0xfffffffffffffff;
      auVar38._8_4_ = (int)uVar33;
      auVar38._0_8_ = uVar33;
      auVar38._12_4_ = (int)(uVar33 >> 0x20);
      psVar34 = psVar32 + 0xf;
      lVar35 = 0;
      do {
        auVar57._8_4_ = (int)lVar35;
        auVar57._0_8_ = lVar35;
        auVar57._12_4_ = (int)((ulong)lVar35 >> 0x20);
        auVar60 = auVar38 ^ auVar39;
        auVar65 = (auVar57 | auVar28) ^ auVar39;
        iVar59 = auVar60._0_4_;
        iVar78 = -(uint)(iVar59 < auVar65._0_4_);
        iVar62 = auVar60._4_4_;
        auVar67._4_4_ = -(uint)(iVar62 < auVar65._4_4_);
        iVar63 = auVar60._8_4_;
        iVar82 = -(uint)(iVar63 < auVar65._8_4_);
        iVar64 = auVar60._12_4_;
        auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
        auVar41._4_4_ = iVar78;
        auVar41._0_4_ = iVar78;
        auVar41._8_4_ = iVar82;
        auVar41._12_4_ = iVar82;
        auVar40 = pshuflw(auVar40,auVar41,0xe8);
        auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar62);
        auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar65 = pshuflw(in_XMM2,auVar66,0xe8);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar41 = pshuflw(auVar40,auVar67,0xe8);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar41 | auVar65 & auVar40) ^ auVar60;
        auVar40 = packssdw(auVar60,auVar60);
        if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar34[-0xf].distance_from_desired = -1;
        }
        auVar10._4_4_ = iVar78;
        auVar10._0_4_ = iVar78;
        auVar10._8_4_ = iVar82;
        auVar10._12_4_ = iVar82;
        auVar67 = auVar66 & auVar10 | auVar67;
        auVar40 = packssdw(auVar67,auVar67);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 ^ auVar65,auVar40 ^ auVar65);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._0_4_ >> 8 & 1) != 0) {
          psVar34[-0xe].distance_from_desired = -1;
        }
        auVar40 = (auVar57 | auVar27) ^ auVar39;
        auVar50._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
        auVar50._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
        auVar50._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
        auVar50._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
        auVar68._4_4_ = auVar50._0_4_;
        auVar68._0_4_ = auVar50._0_4_;
        auVar68._8_4_ = auVar50._8_4_;
        auVar68._12_4_ = auVar50._8_4_;
        iVar78 = -(uint)(auVar40._4_4_ == iVar62);
        iVar82 = -(uint)(auVar40._12_4_ == iVar64);
        auVar11._4_4_ = iVar78;
        auVar11._0_4_ = iVar78;
        auVar11._8_4_ = iVar82;
        auVar11._12_4_ = iVar82;
        auVar79._4_4_ = auVar50._4_4_;
        auVar79._0_4_ = auVar50._4_4_;
        auVar79._8_4_ = auVar50._12_4_;
        auVar79._12_4_ = auVar50._12_4_;
        auVar40 = auVar11 & auVar68 | auVar79;
        auVar40 = packssdw(auVar40,auVar40);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 ^ auVar1,auVar40 ^ auVar1);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
          psVar34[-0xd].distance_from_desired = -1;
        }
        auVar40 = pshufhw(auVar40,auVar68,0x84);
        auVar12._4_4_ = iVar78;
        auVar12._0_4_ = iVar78;
        auVar12._8_4_ = iVar82;
        auVar12._12_4_ = iVar82;
        auVar41 = pshufhw(auVar50,auVar12,0x84);
        auVar60 = pshufhw(auVar40,auVar79,0x84);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar42 = (auVar60 | auVar41 & auVar40) ^ auVar42;
        auVar40 = packssdw(auVar42,auVar42);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
          psVar34[-0xc].distance_from_desired = -1;
        }
        auVar40 = (auVar57 | auVar26) ^ auVar39;
        auVar51._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
        auVar51._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
        auVar51._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
        auVar51._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
        auVar13._4_4_ = auVar51._0_4_;
        auVar13._0_4_ = auVar51._0_4_;
        auVar13._8_4_ = auVar51._8_4_;
        auVar13._12_4_ = auVar51._8_4_;
        auVar41 = pshuflw(auVar79,auVar13,0xe8);
        auVar43._0_4_ = -(uint)(auVar40._0_4_ == iVar59);
        auVar43._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
        auVar43._8_4_ = -(uint)(auVar40._8_4_ == iVar63);
        auVar43._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
        auVar69._4_4_ = auVar43._4_4_;
        auVar69._0_4_ = auVar43._4_4_;
        auVar69._8_4_ = auVar43._12_4_;
        auVar69._12_4_ = auVar43._12_4_;
        auVar40 = pshuflw(auVar43,auVar69,0xe8);
        auVar70._4_4_ = auVar51._4_4_;
        auVar70._0_4_ = auVar51._4_4_;
        auVar70._8_4_ = auVar51._12_4_;
        auVar70._12_4_ = auVar51._12_4_;
        auVar60 = pshuflw(auVar51,auVar70,0xe8);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 & auVar41,(auVar60 | auVar40 & auVar41) ^ auVar2);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar34[-0xb].distance_from_desired = -1;
        }
        auVar14._4_4_ = auVar51._0_4_;
        auVar14._0_4_ = auVar51._0_4_;
        auVar14._8_4_ = auVar51._8_4_;
        auVar14._12_4_ = auVar51._8_4_;
        auVar70 = auVar69 & auVar14 | auVar70;
        auVar60 = packssdw(auVar70,auVar70);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40,auVar60 ^ auVar3);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._4_2_ >> 8 & 1) != 0) {
          psVar34[-10].distance_from_desired = -1;
        }
        auVar40 = (auVar57 | auVar25) ^ auVar39;
        auVar52._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
        auVar52._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
        auVar52._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
        auVar52._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
        auVar71._4_4_ = auVar52._0_4_;
        auVar71._0_4_ = auVar52._0_4_;
        auVar71._8_4_ = auVar52._8_4_;
        auVar71._12_4_ = auVar52._8_4_;
        iVar78 = -(uint)(auVar40._4_4_ == iVar62);
        iVar82 = -(uint)(auVar40._12_4_ == iVar64);
        auVar15._4_4_ = iVar78;
        auVar15._0_4_ = iVar78;
        auVar15._8_4_ = iVar82;
        auVar15._12_4_ = iVar82;
        auVar80._4_4_ = auVar52._4_4_;
        auVar80._0_4_ = auVar52._4_4_;
        auVar80._8_4_ = auVar52._12_4_;
        auVar80._12_4_ = auVar52._12_4_;
        auVar40 = auVar15 & auVar71 | auVar80;
        auVar40 = packssdw(auVar40,auVar40);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 ^ auVar4,auVar40 ^ auVar4);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar34[-9].distance_from_desired = -1;
        }
        auVar40 = pshufhw(auVar40,auVar71,0x84);
        auVar16._4_4_ = iVar78;
        auVar16._0_4_ = iVar78;
        auVar16._8_4_ = iVar82;
        auVar16._12_4_ = iVar82;
        auVar41 = pshufhw(auVar52,auVar16,0x84);
        auVar60 = pshufhw(auVar40,auVar80,0x84);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar44 = (auVar60 | auVar41 & auVar40) ^ auVar44;
        auVar40 = packssdw(auVar44,auVar44);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._6_2_ >> 8 & 1) != 0) {
          psVar34[-8].distance_from_desired = -1;
        }
        auVar40 = (auVar57 | auVar24) ^ auVar39;
        auVar53._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
        auVar53._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
        auVar53._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
        auVar53._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
        auVar17._4_4_ = auVar53._0_4_;
        auVar17._0_4_ = auVar53._0_4_;
        auVar17._8_4_ = auVar53._8_4_;
        auVar17._12_4_ = auVar53._8_4_;
        auVar41 = pshuflw(auVar80,auVar17,0xe8);
        auVar45._0_4_ = -(uint)(auVar40._0_4_ == iVar59);
        auVar45._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
        auVar45._8_4_ = -(uint)(auVar40._8_4_ == iVar63);
        auVar45._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
        auVar72._4_4_ = auVar45._4_4_;
        auVar72._0_4_ = auVar45._4_4_;
        auVar72._8_4_ = auVar45._12_4_;
        auVar72._12_4_ = auVar45._12_4_;
        auVar40 = pshuflw(auVar45,auVar72,0xe8);
        auVar73._4_4_ = auVar53._4_4_;
        auVar73._0_4_ = auVar53._4_4_;
        auVar73._8_4_ = auVar53._12_4_;
        auVar73._12_4_ = auVar53._12_4_;
        auVar60 = pshuflw(auVar53,auVar73,0xe8);
        auVar54._8_4_ = 0xffffffff;
        auVar54._0_8_ = 0xffffffffffffffff;
        auVar54._12_4_ = 0xffffffff;
        auVar54 = (auVar60 | auVar40 & auVar41) ^ auVar54;
        auVar60 = packssdw(auVar54,auVar54);
        auVar40 = packsswb(auVar40 & auVar41,auVar60);
        if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar34[-7].distance_from_desired = -1;
        }
        auVar18._4_4_ = auVar53._0_4_;
        auVar18._0_4_ = auVar53._0_4_;
        auVar18._8_4_ = auVar53._8_4_;
        auVar18._12_4_ = auVar53._8_4_;
        auVar73 = auVar72 & auVar18 | auVar73;
        auVar60 = packssdw(auVar73,auVar73);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar5,auVar60 ^ auVar5);
        auVar40 = packsswb(auVar40,auVar60);
        if ((auVar40._8_2_ >> 8 & 1) != 0) {
          psVar34[-6].distance_from_desired = -1;
        }
        auVar40 = (auVar57 | auVar23) ^ auVar39;
        auVar55._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
        auVar55._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
        auVar55._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
        auVar55._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
        auVar74._4_4_ = auVar55._0_4_;
        auVar74._0_4_ = auVar55._0_4_;
        auVar74._8_4_ = auVar55._8_4_;
        auVar74._12_4_ = auVar55._8_4_;
        iVar78 = -(uint)(auVar40._4_4_ == iVar62);
        iVar82 = -(uint)(auVar40._12_4_ == iVar64);
        auVar19._4_4_ = iVar78;
        auVar19._0_4_ = iVar78;
        auVar19._8_4_ = iVar82;
        auVar19._12_4_ = iVar82;
        auVar81._4_4_ = auVar55._4_4_;
        auVar81._0_4_ = auVar55._4_4_;
        auVar81._8_4_ = auVar55._12_4_;
        auVar81._12_4_ = auVar55._12_4_;
        auVar40 = auVar19 & auVar74 | auVar81;
        auVar40 = packssdw(auVar40,auVar40);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar34[-5].distance_from_desired = -1;
        }
        auVar40 = pshufhw(auVar40,auVar74,0x84);
        auVar20._4_4_ = iVar78;
        auVar20._0_4_ = iVar78;
        auVar20._8_4_ = iVar82;
        auVar20._12_4_ = iVar82;
        auVar41 = pshufhw(auVar55,auVar20,0x84);
        auVar60 = pshufhw(auVar40,auVar81,0x84);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar46 = (auVar60 | auVar41 & auVar40) ^ auVar46;
        auVar40 = packssdw(auVar46,auVar46);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._10_2_ >> 8 & 1) != 0) {
          psVar34[-4].distance_from_desired = -1;
        }
        auVar40 = (auVar57 | _DAT_003e73f0) ^ auVar39;
        auVar56._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
        auVar56._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
        auVar56._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
        auVar56._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
        auVar21._4_4_ = auVar56._0_4_;
        auVar21._0_4_ = auVar56._0_4_;
        auVar21._8_4_ = auVar56._8_4_;
        auVar21._12_4_ = auVar56._8_4_;
        auVar41 = pshuflw(auVar81,auVar21,0xe8);
        auVar47._0_4_ = -(uint)(auVar40._0_4_ == iVar59);
        auVar47._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
        auVar47._8_4_ = -(uint)(auVar40._8_4_ == iVar63);
        auVar47._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
        auVar75._4_4_ = auVar47._4_4_;
        auVar75._0_4_ = auVar47._4_4_;
        auVar75._8_4_ = auVar47._12_4_;
        auVar75._12_4_ = auVar47._12_4_;
        auVar40 = pshuflw(auVar47,auVar75,0xe8);
        auVar76._4_4_ = auVar56._4_4_;
        auVar76._0_4_ = auVar56._4_4_;
        auVar76._8_4_ = auVar56._12_4_;
        auVar76._12_4_ = auVar56._12_4_;
        auVar60 = pshuflw(auVar56,auVar76,0xe8);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 & auVar41,(auVar60 | auVar40 & auVar41) ^ auVar7);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar34[-3].distance_from_desired = -1;
        }
        auVar22._4_4_ = auVar56._0_4_;
        auVar22._0_4_ = auVar56._0_4_;
        auVar22._8_4_ = auVar56._8_4_;
        auVar22._12_4_ = auVar56._8_4_;
        auVar76 = auVar75 & auVar22 | auVar76;
        auVar60 = packssdw(auVar76,auVar76);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40,auVar60 ^ auVar8);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._12_2_ >> 8 & 1) != 0) {
          psVar34[-2].distance_from_desired = -1;
        }
        auVar40 = (auVar57 | _DAT_003e73e0) ^ auVar39;
        auVar48._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
        auVar48._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
        auVar48._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
        auVar48._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
        auVar77._4_4_ = auVar48._0_4_;
        auVar77._0_4_ = auVar48._0_4_;
        auVar77._8_4_ = auVar48._8_4_;
        auVar77._12_4_ = auVar48._8_4_;
        auVar58._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
        auVar58._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar61._4_4_ = auVar48._4_4_;
        auVar61._0_4_ = auVar48._4_4_;
        auVar61._8_4_ = auVar48._12_4_;
        auVar61._12_4_ = auVar48._12_4_;
        auVar60 = auVar58 & auVar77 | auVar61;
        auVar40 = packssdw(auVar48,auVar60);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 ^ auVar9,auVar40 ^ auVar9);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar34[-1].distance_from_desired = -1;
        }
        auVar40 = pshufhw(auVar40,auVar77,0x84);
        in_XMM2 = pshufhw(auVar60,auVar58,0x84);
        in_XMM2 = in_XMM2 & auVar40;
        auVar40 = pshufhw(auVar40,auVar61,0x84);
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar49 = (auVar40 | in_XMM2) ^ auVar49;
        auVar40 = packssdw(auVar49,auVar49);
        auVar40 = packsswb(auVar40,auVar40);
        if ((auVar40._14_2_ >> 8 & 1) != 0) {
          psVar34->distance_from_desired = -1;
        }
        lVar35 = lVar35 + 0x10;
        psVar34 = psVar34 + 0x10;
      } while ((uVar33 - ((uint)uVar31 & 0xf)) + 0x10 != lVar35);
    }
    psVar32[local_38 + ((ulong)bVar36 - 1)].distance_from_desired = '\0';
    begin = this->entries;
    sVar30 = this->num_slots_minus_one;
    this->entries = psVar32;
    this->num_slots_minus_one = local_38 - 1;
    (this->hash_policy).shift = iVar29;
    max_lookups = this->max_lookups;
    this->max_lookups = bVar36;
    this->num_elements = 0;
    local_38 = sVar30;
    if (begin != begin + sVar30 + (long)max_lookups) {
      key = &begin->field_1;
      lVar35 = sVar30 * 0x10 + (long)max_lookups * 0x10;
      do {
        if (-1 < ((sherwood_v3_entry<const_slang::ast::Type_*> *)(key + -1))->distance_from_desired)
        {
          sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
          ::emplace<slang::ast::Type_const*>
                    ((sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
                      *)this,&key->value);
          ((sherwood_v3_entry<const_slang::ast::Type_*> *)(key + -1))->distance_from_desired = -1;
        }
        key = key + 2;
        lVar35 = lVar35 + -0x10;
      } while (lVar35 != 0);
    }
    deallocate_data(this,begin,local_38,max_lookups);
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }